

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
          (list_caster<std::vector<long,_std::allocator<long>_>,_long> *this,handle src,bool convert
          )

{
  handle h;
  bool bVar1;
  undefined1 uVar2;
  It *in_RDI;
  value_conv conv;
  reference it;
  sequence_iterator __end3;
  sequence_iterator __begin3;
  sequence *__range3;
  sequence s;
  It *in_stack_fffffffffffffef8;
  handle in_stack_ffffffffffffff00;
  undefined5 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  list_caster<std::vector<long,_std::allocator<long>_>,_long> *in_stack_ffffffffffffff10;
  undefined7 local_b8;
  undefined1 in_stack_ffffffffffffff4f;
  handle in_stack_ffffffffffffff58;
  byte local_1;
  
  bVar1 = isinstance<pybind11::sequence,_0>(in_stack_ffffffffffffff00);
  if ((!bVar1) || (bVar1 = isinstance<pybind11::str,_0>(in_stack_ffffffffffffff00), bVar1)) {
    local_1 = 0;
  }
  else {
    h.m_ptr._5_1_ = in_stack_ffffffffffffff0d;
    h.m_ptr._0_5_ = in_stack_ffffffffffffff08;
    h.m_ptr._6_1_ = in_stack_ffffffffffffff0e;
    h.m_ptr._7_1_ = in_stack_ffffffffffffff0f;
    reinterpret_borrow<pybind11::sequence>(h);
    std::vector<long,_std::allocator<long>_>::clear((vector<long,_std::allocator<long>_> *)0x2c4136)
    ;
    sequence::sequence((sequence *)in_stack_ffffffffffffff00.m_ptr,
                       (sequence *)in_stack_fffffffffffffef8);
    reserve_maybe<std::vector<long,_std::allocator<long>_>,_0>
              (in_stack_ffffffffffffff10,
               (sequence *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,
                                 CONCAT15(in_stack_ffffffffffffff0d,in_stack_ffffffffffffff08))),
               (vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff00.m_ptr);
    sequence::~sequence((sequence *)0x2c416e);
    sequence::begin((sequence *)in_stack_ffffffffffffff00.m_ptr);
    sequence::end((sequence *)in_stack_ffffffffffffff00.m_ptr);
    while (uVar2 = detail::operator!=((It *)in_stack_ffffffffffffff00.m_ptr,
                                      in_stack_fffffffffffffef8), (bool)uVar2) {
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator*
                (in_stack_fffffffffffffef8);
      accessor::operator_cast_to_object
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)
                 CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff0e,
                                         CONCAT15(in_stack_ffffffffffffff0d,
                                                  in_stack_ffffffffffffff08))));
      in_stack_ffffffffffffff0e =
           type_caster<long,_void>::load
                     ((type_caster<long,_void> *)CONCAT17(in_stack_ffffffffffffff4f,local_b8),
                      in_stack_ffffffffffffff58,(bool)in_stack_ffffffffffffff4f);
      in_stack_ffffffffffffff0d = in_stack_ffffffffffffff0e ^ 0xff;
      object::~object((object *)0x2c426f);
      bVar1 = (in_stack_ffffffffffffff0d & 1) != 0;
      if (bVar1) {
        local_1 = 0;
      }
      else {
        in_stack_fffffffffffffef8 = in_RDI;
        in_stack_ffffffffffffff00.m_ptr =
             (PyObject *)cast_op<long&&>((make_caster<long_&&> *)0x2c4319);
        std::vector<long,_std::allocator<long>_>::push_back
                  ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff00.m_ptr,
                   (value_type_conflict *)in_stack_fffffffffffffef8);
      }
      accessor<pybind11::detail::accessor_policies::sequence_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::sequence_item> *)0x2c4342);
      if (bVar1) goto LAB_002c437e;
      generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite>::operator++
                ((generic_iterator<pybind11::detail::iterator_policies::sequence_slow_readwrite> *)
                 in_stack_ffffffffffffff00.m_ptr);
    }
    local_1 = 1;
LAB_002c437e:
    sequence::~sequence((sequence *)0x2c438b);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }